

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O0

void __thiscall
soplex::
ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
::ClassSet(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
           *this,int pmax)

{
  int in_ESI;
  long *in_RDI;
  SPxMemoryException *x;
  int i;
  int local_3c;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  local_3c = in_ESI;
  if (in_ESI < 1) {
    local_3c = 8;
  }
  *(int *)(in_RDI + 2) = local_3c;
  *(undefined4 *)((long)in_RDI + 0x14) = 0;
  *(undefined4 *)(in_RDI + 3) = 0;
  *(int *)((long)in_RDI + 0x1c) = -1 - (int)in_RDI[2];
  spx_alloc<soplex::ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::DLPSV>::Item*>
            ((Item **)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  for (iVar1 = 0; iVar1 < (int)in_RDI[2]; iVar1 = iVar1 + 1) {
    memset((void *)(*in_RDI + (long)iVar1 * 0x28),0,0x28);
    Item::Item((Item *)0x4ed3ff);
  }
  spx_alloc<soplex::DataKey*>((DataKey **)CONCAT44(in_ESI,iVar1),in_stack_ffffffffffffffec);
  return;
}

Assistant:

explicit
   ClassSet(int pmax = 8)
      : theitem(nullptr)
      , thekey(nullptr)
      , themax(pmax < 1 ? 8 : pmax)
      , thesize(0)
      , thenum(0)

   {
      firstfree = -themax - 1;

      spx_alloc(theitem, themax);

      /* call default constructor for each element */
      for(int i = 0; i < themax; i++)
         new(&(theitem[i])) Item();

      try
      {
         spx_alloc(thekey, themax);
      }
      catch(const SPxMemoryException& x)
      {
         spx_free(theitem);
         throw x;
      }

      assert(isConsistent());
   }